

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<const_solitaire::geometry::Area_&>::Matcher
          (Matcher<const_solitaire::geometry::Area_&> *this,Area *value)

{
  MatcherBase<const_solitaire::geometry::Area_&> local_40;
  EqMatcher<solitaire::geometry::Area> local_28;
  
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_002f7010;
  local_28.
  super_ComparisonBase<testing::internal::EqMatcher<solitaire::geometry::Area>,_solitaire::geometry::Area,_testing::internal::AnyEq>
  .rhs_.position = value->position;
  local_28.
  super_ComparisonBase<testing::internal::EqMatcher<solitaire::geometry::Area>,_solitaire::geometry::Area,_testing::internal::AnyEq>
  .rhs_.size = value->size;
  Matcher<solitaire::geometry::Area_const&>::
  Matcher<testing::internal::EqMatcher<solitaire::geometry::Area>,void>
            ((Matcher<solitaire::geometry::Area_const&> *)&local_40,&local_28);
  internal::MatcherBase<const_solitaire::geometry::Area_&>::operator=
            (&this->super_MatcherBase<const_solitaire::geometry::Area_&>,&local_40);
  internal::MatcherBase<const_solitaire::geometry::Area_&>::~MatcherBase(&local_40);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }